

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

void compute_accelerated_huffman(Codebook *c)

{
  uint8 uVar1;
  uint8 *puVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  
  memset(c->fast_huffman,0xff,0x800);
  uVar1 = c->sparse;
  piVar5 = &c->entries;
  if (uVar1 != '\0') {
    piVar5 = &c->sorted_entries;
  }
  uVar4 = *piVar5;
  if (0 < (int)uVar4) {
    uVar3 = 0x7fff;
    if (uVar4 < 0x7fff) {
      uVar3 = uVar4;
    }
    puVar2 = c->codeword_lengths;
    uVar6 = 0;
    do {
      if (puVar2[uVar6] < 0xb) {
        if (uVar1 == '\0') {
          uVar4 = c->codewords[uVar6];
        }
        else {
          uVar4 = c->sorted_codewords[uVar6];
          uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          uVar4 = (uVar4 & 0xf0f0f0f) << 4 | uVar4 >> 4 & 0xf0f0f0f;
          uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333) * 4;
          uVar4 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555) * 2;
        }
        for (; uVar4 < 0x400; uVar4 = uVar4 + (1 << (puVar2[uVar6] & 0x1f))) {
          c->fast_huffman[uVar4] = (int16)uVar6;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar3);
  }
  return;
}

Assistant:

static void compute_accelerated_huffman(Codebook *c)
{
   int i, len;
   for (i=0; i < FAST_HUFFMAN_TABLE_SIZE; ++i)
      c->fast_huffman[i] = -1;

   len = c->sparse ? c->sorted_entries : c->entries;
   #ifdef STB_VORBIS_FAST_HUFFMAN_SHORT
   if (len > 32767) len = 32767; // largest possible value we can encode!
   #endif
   for (i=0; i < len; ++i) {
      if (c->codeword_lengths[i] <= STB_VORBIS_FAST_HUFFMAN_LENGTH) {
         uint32 z = c->sparse ? bit_reverse(c->sorted_codewords[i]) : c->codewords[i];
         // set table entries for all bit combinations in the higher bits
         while (z < FAST_HUFFMAN_TABLE_SIZE) {
             c->fast_huffman[z] = i;
             z += 1 << c->codeword_lengths[i];
         }
      }
   }
}